

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

opj_bool opj_stream_flush(opj_stream_private_t *p_stream,opj_event_mgr_t *p_event_mgr)

{
  OPJ_SIZE_T OVar1;
  OPJ_BYTE *pOVar2;
  
  pOVar2 = p_stream->m_stored_data;
  p_stream->m_current_data = pOVar2;
  OVar1 = p_stream->m_bytes_in_buffer;
  if (OVar1 != 0) {
    do {
      OVar1 = (*p_stream->m_write_fn)(pOVar2,OVar1,p_stream->m_user_data);
      if (OVar1 == 0xffffffff) {
        *(byte *)&p_stream->m_status = (byte)p_stream->m_status | 8;
        opj_event_msg_v2(p_event_mgr,4,"Error on writting stream!\n");
        return 1;
      }
      pOVar2 = p_stream->m_current_data + OVar1;
      p_stream->m_current_data = pOVar2;
      OVar1 = p_stream->m_bytes_in_buffer - OVar1;
      p_stream->m_bytes_in_buffer = OVar1;
    } while (OVar1 != 0);
    pOVar2 = p_stream->m_stored_data;
  }
  p_stream->m_current_data = pOVar2;
  return 0;
}

Assistant:

opj_bool opj_stream_flush (opj_stream_private_t * p_stream, opj_event_mgr_t * p_event_mgr)
{
	// the number of bytes written on the media.
	OPJ_SIZE_T l_current_write_nb_bytes = 0;
	p_stream->m_current_data = p_stream->m_stored_data;

	while
		(p_stream->m_bytes_in_buffer)
	{
		// we should do an actual write on the media
		l_current_write_nb_bytes = p_stream->m_write_fn(p_stream->m_current_data,p_stream->m_bytes_in_buffer,p_stream->m_user_data);
		if
			(l_current_write_nb_bytes == -1)
		{
			p_stream->m_status |= opj_stream_e_error;
			opj_event_msg_v2(p_event_mgr, EVT_INFO, "Error on writting stream!\n");

			return EXIT_FAILURE;
		}
		p_stream->m_current_data += l_current_write_nb_bytes;
		p_stream->m_bytes_in_buffer -= l_current_write_nb_bytes;
	}
	p_stream->m_current_data = p_stream->m_stored_data;
	return EXIT_SUCCESS;
}